

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightedSnapshot.cc
# Opt level: O0

double __thiscall cppmetrics::WeightedSnapshot::get_std_dev(WeightedSnapshot *this)

{
  bool bVar1;
  size_type sVar2;
  reference pEVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  double diff;
  Element *elem;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
  *__range1;
  double variance;
  double mean;
  WeightedSnapshot *this_local;
  
  sVar2 = std::
          vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
          ::size(&this->m_elements);
  if (sVar2 < 2) {
    this_local = (WeightedSnapshot *)0x0;
  }
  else {
    (*(this->super_Snapshot)._vptr_Snapshot[5])();
    __range1 = (vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
                *)0x0;
    __end1 = std::
             vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
             ::begin(&this->m_elements);
    elem = (Element *)
           std::
           vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
           ::end(&this->m_elements);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_cppmetrics::WeightedSnapshot::Element_*,_std::vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>_>
                                  *)&elem);
      if (!bVar1) break;
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_cppmetrics::WeightedSnapshot::Element_*,_std::vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>_>
               ::operator*(&__end1);
      dVar4 = (double)pEVar3->value - extraout_XMM0_Qa;
      __range1 = (vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
                  *)(pEVar3->norm_weight * dVar4 * dVar4 + (double)__range1);
      __gnu_cxx::
      __normal_iterator<const_cppmetrics::WeightedSnapshot::Element_*,_std::vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>_>
      ::operator++(&__end1);
    }
    this_local = (WeightedSnapshot *)sqrt((double)__range1);
  }
  return (double)this_local;
}

Assistant:

double WeightedSnapshot::get_std_dev() const
{
  if (m_elements.size() <= 1)
  {
    return 0.0;
  }

  const double mean = get_mean();
  double variance = 0.0;

  for (auto&& elem : m_elements)
  {
    double diff = elem.value - mean;
    variance += elem.norm_weight * diff * diff;
  }

  return sqrt(variance);
}